

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O1

void __thiscall
Kernel::DisagreementSetIterator::DisagreementSetIterator
          (DisagreementSetIterator *this,Term *t1,Term *t2,bool disjunctVariables)

{
  TermList **ppTVar1;
  
  (this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = 0;
  (this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore =
       (_func_int **)&PTR__DisagreementSetIterator_00b69b80;
  (this->_stack)._capacity = 8;
  ppTVar1 = (TermList **)
            ::Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  (this->_stack)._stack = ppTVar1;
  (this->_stack)._cursor = ppTVar1;
  (this->_stack)._end = ppTVar1 + (this->_stack)._capacity;
  this->_disjunctVariables = disjunctVariables;
  (this->_arg1)._content = 2;
  (this->_arg2)._content = 2;
  reset(this,t1,t2,disjunctVariables);
  return;
}

Assistant:

DisagreementSetIterator(Term* t1, Term* t2, bool disjunctVariables=true)
  : _stack(8), _disjunctVariables(disjunctVariables)
  {
    reset(t1,t2,disjunctVariables);
  }